

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vary_output_len.c
# Opt level: O2

int generate_input(uint8_t *buf,int len)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)len;
  if (len < 1) {
    uVar2 = 0;
  }
  while( true ) {
    bVar3 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar3) break;
    *buf = (char)((ulong)uVar1 / 0xfb) * '\x05' + (char)uVar1;
    buf = buf + 1;
    uVar1 = uVar1 + 1;
  }
  return (int)((ulong)uVar1 / 0xfb);
}

Assistant:

int generate_input(uint8_t *buf, int len)
{
	for (int i = 0; i < len; i++) {
		buf[i] = i % TEST_INPUT_MODULO;
	}
}